

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

void __thiscall timer::operator()(timer *this,error_code *e)

{
  uint uVar1;
  ptime *ppVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ptime pVar6;
  canceler func;
  undefined1 auVar7 [12];
  callback<void_(const_std::error_code_&)> local_60;
  undefined1 local_58 [12];
  ptime local_48;
  undefined1 local_38 [12];
  
  if (this->cancel == true) {
    if ((e->_M_cat != booster::aio::aio_error_cat) || (e->_M_value != 1)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar5 = std::operator<<(poVar5,
                               "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
                              );
      poVar5 = std::operator<<(poVar5," at ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
      std::endl<char,std::char_traits<char>>(poVar5);
      return_code = 1;
    }
    booster::aio::io_service::stop();
    timer_done = true;
  }
  else {
    if (e->_M_value != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar5 = std::operator<<(poVar5,"!e");
      poVar5 = std::operator<<(poVar5," at ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x62);
      std::endl<char,std::char_traits<char>>(poVar5);
      return_code = 1;
    }
    local_58 = booster::ptime::now();
    bVar3 = booster::ptime::operator>=((ptime *)local_58,&this->t);
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar5 = std::operator<<(poVar5,"booster::ptime::now() >= t");
      poVar5 = std::operator<<(poVar5," at ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,99);
      std::endl<char,std::char_traits<char>>(poVar5);
      return_code = 1;
    }
    this->cancel = true;
    ppVar2 = (ptime *)this->srv;
    local_38 = booster::ptime::now();
    pVar6 = booster::ptime::seconds(10);
    local_48.sec = pVar6.sec;
    local_48.nsec = pVar6.nsec;
    pVar6 = booster::ptime::operator+((ptime *)local_38,&local_48);
    local_58._0_8_ = pVar6.sec;
    local_58._8_4_ = pVar6.nsec;
    booster::callback<void_(const_std::error_code_&)>::callback<timer>(&local_60,*this);
    iVar4 = booster::aio::io_service::set_timer_event(ppVar2,(callback *)local_58);
    this->event_id = iVar4;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_60.call_ptr);
    uVar1 = this->event_id;
    ppVar2 = (ptime *)this->srv;
    auVar7 = booster::ptime::now();
    local_38 = auVar7;
    pVar6 = booster::ptime::milliseconds(100);
    local_48.sec = pVar6.sec;
    local_48.nsec = pVar6.nsec;
    pVar6 = booster::ptime::operator+((ptime *)local_38,&local_48);
    local_58._0_8_ = pVar6.sec;
    local_58._8_4_ = pVar6.nsec;
    func._4_4_ = 0;
    func.event_id = uVar1;
    func.srv = (io_service *)ppVar2;
    booster::callback<void_(const_std::error_code_&)>::callback<timer::canceler>(&local_60,func);
    booster::aio::io_service::set_timer_event(ppVar2,(callback *)local_58);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_60.call_ptr);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		if(cancel) {
			TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
			srv->stop();
			timer_done = true;
		}
		else {
			TEST(!e);
			TEST(booster::ptime::now() >= t);
			cancel=true;
			event_id = srv->set_timer_event(booster::ptime::now() + ptime::seconds(10),*this);
			canceler c = {event_id,srv};
			srv->set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
		}

	}